

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
boost::unit_test::test_observer::assertion_result(test_observer *this,assertion_result ar)

{
  int in_ESI;
  long *in_RDI;
  
  if (in_ESI == 0) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,0);
  }
  else if (in_ESI == 1) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,1);
  }
  return;
}

Assistant:

virtual void    assertion_result( unit_test::assertion_result ar )
    {
        switch( ar ) {
        case AR_PASSED: assertion_result( true ); break;
        case AR_FAILED: assertion_result( false ); break;
        case AR_TRIGGERED: break;
        default: break;
        }
    }